

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadSphere.h
# Opt level: O2

TPZFMatrix<Fad<double>_> * __thiscall
pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>::TensorProd<Fad<double>>
          (TPZFMatrix<Fad<double>_> *__return_storage_ptr__,TPZQuadSphere<pzgeom::TPZGeoQuad> *this,
          TPZFMatrix<Fad<double>_> *vec1,TPZFMatrix<Fad<double>_> *vec2)

{
  Fad<double> *pFVar1;
  int j;
  long row;
  int i;
  long row_00;
  undefined1 local_220 [16];
  double *local_210;
  double dStack_208;
  TPZFNMatrix<9,_Fad<double>_> res;
  
  local_220._0_8_ = (Fad<double> *)0x0;
  local_220._8_8_ = local_220._8_8_ & 0xffffffff00000000;
  local_210 = (double *)0x0;
  dStack_208 = 0.0;
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&res,3,3,(Fad<double> *)local_220);
  Fad<double>::~Fad((Fad<double> *)local_220);
  for (row_00 = 0; row_00 != 3; row_00 = row_00 + 1) {
    for (row = 0; row != 3; row = row + 1) {
      pFVar1 = TPZFMatrix<Fad<double>_>::operator()((TPZFMatrix<Fad<double>_> *)this,row_00,0);
      local_220._8_8_ = TPZFMatrix<Fad<double>_>::operator()(vec1,row,0);
      local_220._0_8_ = pFVar1;
      pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&res.super_TPZFMatrix<Fad<double>_>,row_00,row);
      Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_220);
    }
  }
  TPZFMatrix<Fad<double>_>::TPZFMatrix(__return_storage_ptr__,&res.super_TPZFMatrix<Fad<double>_>);
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&res);
  return __return_storage_ptr__;
}

Assistant:

static TPZFMatrix<T> TensorProd(TPZFMatrix<T> &vec1, TPZFMatrix<T> &vec2)
        {
            TPZFNMatrix<9,T> res(3,3,0.);
            for (int i = 0; i < 3; i++) {
                for (int j = 0; j < 3; j++) {
                    res(i,j) = vec1(i,0) * vec2(j,0);
                }
            }
            return res;
        }